

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall
fmt::v8::detail::
iterator_buffer<std::back_insert_iterator<fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>_>,_char,_fmt::v8::detail::buffer_traits>
::grow(iterator_buffer<std::back_insert_iterator<fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>_>,_char,_fmt::v8::detail::buffer_traits>
       *this,size_t capacity)

{
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *pbVar1;
  ulong uVar2;
  
  pbVar1 = this->container_;
  if ((pbVar1->super_buffer<char>).capacity_ < capacity) {
    (**(pbVar1->super_buffer<char>)._vptr_buffer)(pbVar1,capacity);
  }
  uVar2 = (pbVar1->super_buffer<char>).capacity_;
  if (capacity <= uVar2) {
    uVar2 = capacity;
  }
  (pbVar1->super_buffer<char>).size_ = uVar2;
  (this->super_buffer<char>).ptr_ = (this->container_->super_buffer<char>).ptr_;
  (this->super_buffer<char>).capacity_ = capacity;
  return;
}

Assistant:

FMT_CONSTEXPR20 void grow(size_t capacity) override {
    container_.resize(capacity);
    this->set(&container_[0], capacity);
  }